

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MultiThreadedObjectTest::querySetSharedObjects
          (MultiThreadedObjectTest *this,TestThread *thread,int count)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  Library *pLVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference ppvVar9;
  ThreadLog *pTVar10;
  Random *local_b8;
  uint local_a8;
  int local_a4;
  EGLBoolean result_1;
  EGLint value_1;
  EGLint attribute_1;
  EGLint value;
  EGLBoolean result;
  EGLint attribute;
  EGLContext context;
  EGLSurface surface;
  __normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
  local_78;
  Type local_70;
  int local_6c;
  Type type;
  int queryNdx;
  value_type local_60 [5];
  value_type local_4c;
  undefined1 local_48 [8];
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  objectTypes;
  Random *rnd;
  Library *egl;
  int count_local;
  TestThread *thread_local;
  MultiThreadedObjectTest *this_local;
  
  pLVar5 = MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  iVar3 = TestThread::getId(thread);
  if (iVar3 == 0) {
    local_b8 = &this->m_rnd0;
  }
  else {
    local_b8 = &this->m_rnd1;
  }
  objectTypes.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8;
  std::
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ::vector((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
            *)local_48);
  if ((this->m_types & TYPE_PBUFFER) != 0) {
    local_4c = TYPE_PBUFFER;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::push_back((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 *)local_48,&local_4c);
  }
  if ((this->m_types & TYPE_PIXMAP) != 0) {
    local_60[0] = TYPE_PIXMAP;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::push_back((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 *)local_48,local_60);
  }
  bVar2 = std::
          vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
          ::empty(&this->m_sharedNativeWindows);
  if ((!bVar2) && ((this->m_types & TYPE_WINDOW) != 0)) {
    queryNdx = 4;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::push_back((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 *)local_48,(value_type *)&queryNdx);
  }
  if ((this->m_types & TYPE_CONTEXT) != 0) {
    type = TYPE_CONTEXT;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::push_back((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 *)local_48,&type);
  }
  for (local_6c = 0;
      pTVar1 = objectTypes.
               super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage, local_6c < count;
      local_6c = local_6c + 1) {
    local_78._M_current =
         (Type *)std::
                 vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 ::begin((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                          *)local_48);
    surface = (EGLSurface)
              std::
              vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
              ::end((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                     *)local_48);
    local_70 = de::Random::
               choose<deqp::egl::MultiThreadedObjectTest::Type,__gnu_cxx::__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type*,std::vector<deqp::egl::MultiThreadedObjectTest::Type,std::allocator<deqp::egl::MultiThreadedObjectTest::Type>>>>
                         ((Random *)pTVar1,local_78,
                          (__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
                           )surface);
    pTVar1 = objectTypes.
             super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    context = (EGLContext)0x0;
    _result = (value_type)0x0;
    switch(local_70) {
    case TYPE_PBUFFER:
      sVar8 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedPbuffers);
      iVar3 = de::Random::getInt((Random *)pTVar1,0,(int)sVar8 + -1);
      ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_sharedPbuffers,(long)iVar3);
      context = *ppvVar9;
      break;
    case TYPE_PIXMAP:
      sVar8 = std::
              vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ::size(&this->m_sharedNativePixmaps);
      iVar3 = de::Random::getInt((Random *)pTVar1,0,(int)sVar8 + -1);
      pvVar6 = std::
               vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ::operator[](&this->m_sharedNativePixmaps,(long)iVar3);
      context = pvVar6->second;
      break;
    default:
      break;
    case TYPE_WINDOW:
      sVar8 = std::
              vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
              ::size(&this->m_sharedNativeWindows);
      iVar3 = de::Random::getInt((Random *)pTVar1,0,(int)sVar8 + -1);
      pvVar7 = std::
               vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ::operator[](&this->m_sharedNativeWindows,(long)iVar3);
      context = pvVar7->second;
      break;
    case TYPE_CONTEXT:
      sVar8 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedContexts);
      iVar3 = de::Random::getInt((Random *)pTVar1,0,(int)sVar8 + -1);
      ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_sharedContexts,(long)iVar3);
      _result = *ppvVar9;
    }
    if (context == (EGLContext)0x0) {
      if (_result != (value_type)0x0) {
        iVar3 = de::Random::getInt((Random *)
                                   objectTypes.
                                   super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0,3);
        result_1 = querySetSharedObjects::attributes[iVar3];
        local_a8 = (*pLVar5->_vptr_Library[0x29])
                             (pLVar5,(this->super_MultiThreadedTest).m_display,_result,
                              (ulong)result_1,&local_a4);
        pTVar10 = TestThread::getLog(thread);
        pTVar10 = ThreadLog::operator<<(pTVar10,(BeginMessageToken *)&ThreadLog::BeginMessage);
        pTVar10 = ThreadLog::operator<<(pTVar10,&local_a8);
        pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [20])" = eglQueryContext(");
        pTVar10 = ThreadLog::operator<<(pTVar10,&(this->super_MultiThreadedTest).m_display);
        pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [3])0x584b6d);
        pTVar10 = ThreadLog::operator<<(pTVar10,(void **)&result);
        pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [3])0x584b6d);
        pTVar10 = ThreadLog::operator<<(pTVar10,(int *)&result_1);
        pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [3])0x584b6d);
        pTVar10 = ThreadLog::operator<<(pTVar10,&local_a4);
        pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [2])0x5b492c);
        ThreadLog::operator<<(pTVar10,(EndMessageToken *)&ThreadLog::EndMessage);
        dVar4 = (*pLVar5->_vptr_Library[0x1f])();
        eglu::checkError(dVar4,"eglQueryContext()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x591);
      }
    }
    else {
      iVar3 = de::Random::getInt((Random *)
                                 objectTypes.
                                 super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0,2);
      value = querySetSharedObjects::queryAttributes[iVar3];
      attribute_1 = (*pLVar5->_vptr_Library[0x2b])
                              (pLVar5,(this->super_MultiThreadedTest).m_display,context,
                               (ulong)(uint)value,&value_1);
      pTVar10 = TestThread::getLog(thread);
      pTVar10 = ThreadLog::operator<<(pTVar10,(BeginMessageToken *)&ThreadLog::BeginMessage);
      pTVar10 = ThreadLog::operator<<(pTVar10,(uint *)&attribute_1);
      pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [20])" = eglQuerySurface(");
      pTVar10 = ThreadLog::operator<<(pTVar10,&(this->super_MultiThreadedTest).m_display);
      pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [3])0x584b6d);
      pTVar10 = ThreadLog::operator<<(pTVar10,&context);
      pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [3])0x584b6d);
      pTVar10 = ThreadLog::operator<<(pTVar10,&value);
      pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [3])0x584b6d);
      pTVar10 = ThreadLog::operator<<(pTVar10,&value_1);
      pTVar10 = ThreadLog::operator<<(pTVar10,(char (*) [2])0x5b492c);
      ThreadLog::operator<<(pTVar10,(EndMessageToken *)&ThreadLog::EndMessage);
      dVar4 = (*pLVar5->_vptr_Library[0x1f])();
      eglu::checkError(dVar4,"eglQuerySurface()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x57e);
    }
  }
  std::
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ::~vector((vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
             *)local_48);
  return;
}

Assistant:

void MultiThreadedObjectTest::querySetSharedObjects (TestThread& thread, int count)
{
	const Library&		egl		= getLibrary();
	de::Random&			rnd		= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<Type>		objectTypes;

	if ((m_types & TYPE_PBUFFER) != 0)
		objectTypes.push_back(TYPE_PBUFFER);

	if ((m_types & TYPE_PIXMAP) != 0)
		objectTypes.push_back(TYPE_PIXMAP);

	if (!m_sharedNativeWindows.empty() && (m_types & TYPE_WINDOW) != 0)
		objectTypes.push_back(TYPE_WINDOW);

	if ((m_types & TYPE_CONTEXT) != 0)
		objectTypes.push_back(TYPE_CONTEXT);

	for (int queryNdx = 0; queryNdx < count; queryNdx++)
	{
		const Type	type		= rnd.choose<Type>(objectTypes.begin(), objectTypes.end());
		EGLSurface	surface		= EGL_NO_SURFACE;
		EGLContext	context		= EGL_NO_CONTEXT;

		switch (type)
		{
			case TYPE_PBUFFER:
				surface = m_sharedPbuffers[rnd.getInt(0, (int)(m_sharedPbuffers.size()-1))];
				break;

			case TYPE_PIXMAP:
				surface = m_sharedNativePixmaps[rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1))].second;
				break;

			case TYPE_WINDOW:
				surface = m_sharedNativeWindows[rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1))].second;
				break;

			case TYPE_CONTEXT:
				context = m_sharedContexts[rnd.getInt(0, (int)(m_sharedContexts.size()-1))];
				break;

			default:
				DE_ASSERT(false);
		}

		if (surface != EGL_NO_SURFACE)
		{
			static const EGLint queryAttributes[] =
			{
				EGL_LARGEST_PBUFFER,
				EGL_HEIGHT,
				EGL_WIDTH
			};

			const EGLint	attribute	= queryAttributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(queryAttributes) - 1)];
			EGLBoolean		result;
			EGLint			value;

			result = egl.querySurface(m_display, surface, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQuerySurface(" << m_display << ", " << surface << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQuerySurface()");

		}
		else if (context != EGL_NO_CONTEXT)
		{
			static const EGLint attributes[] =
			{
				EGL_CONFIG_ID,
				EGL_CONTEXT_CLIENT_TYPE,
				EGL_CONTEXT_CLIENT_VERSION,
				EGL_RENDER_BUFFER
			};

			const EGLint	attribute = attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLint			value;
			EGLBoolean		result;

			result = egl.queryContext(m_display, context, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQueryContext(" << m_display << ", " << context << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQueryContext()");

		}
		else
			DE_ASSERT(false);
	}
}